

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void Service_TranslateBrowsePathsToNodeIds
               (UA_Server *server,UA_Session *session,
               UA_TranslateBrowsePathsToNodeIdsRequest *request,
               UA_TranslateBrowsePathsToNodeIdsResponse *response)

{
  UA_StatusCode UVar1;
  UA_BrowsePathResult *pUVar2;
  UA_TranslateBrowsePathsToNodeIdsResponse *result;
  long lVar3;
  size_t __nmemb;
  long lVar4;
  
  __nmemb = request->browsePathsSize;
  if (__nmemb == 0) {
    UVar1 = 0x800f0000;
  }
  else {
    result = response;
    pUVar2 = (UA_BrowsePathResult *)calloc(__nmemb,0x18);
    response->results = pUVar2;
    if (pUVar2 != (UA_BrowsePathResult *)0x0) {
      response->resultsSize = __nmemb;
      lVar4 = 0;
      lVar3 = 0;
      do {
        translateBrowsePathToNodeIds
                  (server,(UA_Session *)
                          ((long)&(request->browsePaths->startingNode).namespaceIndex + lVar4),
                   (UA_BrowsePath *)((long)&response->results->statusCode + lVar3),
                   (UA_BrowsePathResult *)result);
        lVar3 = lVar3 + 0x18;
        lVar4 = lVar4 + 0x28;
        __nmemb = __nmemb - 1;
      } while (__nmemb != 0);
      return;
    }
    UVar1 = 0x80030000;
  }
  (response->responseHeader).serviceResult = UVar1;
  return;
}

Assistant:

void Service_TranslateBrowsePathsToNodeIds(UA_Server *server, UA_Session *session,
                                           const UA_TranslateBrowsePathsToNodeIdsRequest *request,
                                           UA_TranslateBrowsePathsToNodeIdsResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing TranslateBrowsePathsToNodeIdsRequest");
    if(request->browsePathsSize <= 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    size_t size = request->browsePathsSize;
    response->results = UA_Array_new(size, &UA_TYPES[UA_TYPES_BROWSEPATHRESULT]);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }

#ifdef UA_ENABLE_EXTERNAL_NAMESPACES
#ifdef NO_ALLOCA
    UA_Boolean isExternal[size];
    UA_UInt32 indices[size];
#else
    UA_Boolean *isExternal = UA_alloca(sizeof(UA_Boolean) * size);
    UA_UInt32 *indices = UA_alloca(sizeof(UA_UInt32) * size);
#endif /* NO_ALLOCA */
    memset(isExternal, false, sizeof(UA_Boolean) * size);
    for(size_t j = 0; j < server->externalNamespacesSize; ++j) {
        size_t indexSize = 0;
        for(size_t i = 0;i < size;++i) {
            if(request->browsePaths[i].startingNode.namespaceIndex != server->externalNamespaces[j].index)
                continue;
            isExternal[i] = true;
            indices[indexSize] = (UA_UInt32)i;
            ++indexSize;
        }
        if(indexSize == 0)
            continue;
        UA_ExternalNodeStore *ens = &server->externalNamespaces[j].externalNodeStore;
        ens->translateBrowsePathsToNodeIds(ens->ensHandle, &request->requestHeader, request->browsePaths,
                                           indices, (UA_UInt32)indexSize, response->results,
                                           response->diagnosticInfos);
    }
    response->resultsSize = size;
    for(size_t i = 0; i < size; ++i) {
        if(!isExternal[i])
            translateBrowsePathToNodeIds(server, session, &request->browsePaths[i],
                                         &response->results[i]);
    }
#else
    response->resultsSize = size;
    for(size_t i = 0; i < size; ++i)
        translateBrowsePathToNodeIds(server, session, &request->browsePaths[i],
                                     &response->results[i]);
#endif
}